

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_text_clamp(nk_user_font *font,char *text,int text_len,float space,int *glyphs,
                 float *text_width,nk_rune *sep_list,int sep_count)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  nk_rune unicode;
  float local_68;
  int local_60;
  int local_5c;
  nk_rune local_4c;
  int *local_48;
  float *local_40;
  char *local_38;
  
  local_4c = 0;
  local_48 = glyphs;
  local_40 = text_width;
  local_38 = text;
  iVar2 = nk_utf_decode(text,&local_4c,text_len);
  local_68 = 0.0;
  bVar1 = 0 < text_len;
  iVar4 = 0;
  iVar5 = 0;
  local_5c = 0;
  local_60 = 0;
  fVar6 = 0.0;
  if ((iVar2 != 0 && bVar1) && 0.0 < space) {
    local_60 = 0;
    fVar6 = 0.0;
    local_5c = 0;
    iVar5 = 0;
    iVar4 = 0;
    local_68 = 0.0;
    fVar8 = 0.0;
    do {
      iVar4 = iVar4 + iVar2;
      fVar7 = (*font->width)(font->userdata,font->height,local_38,iVar4);
      iVar2 = 0;
      do {
        iVar3 = iVar2;
        if (sep_count <= iVar3) goto LAB_00111f5d;
        iVar2 = 1;
      } while (local_4c != *sep_list);
      local_60 = iVar5 + 1;
      local_68 = fVar8;
      fVar6 = fVar8;
      local_5c = iVar4;
LAB_00111f5d:
      iVar5 = iVar5 + 1;
      if (iVar3 == sep_count) {
        fVar6 = fVar8;
        local_68 = fVar8;
        local_60 = iVar5;
      }
      bVar1 = text_len - iVar4 != 0 && iVar4 <= text_len;
      iVar2 = nk_utf_decode(local_38 + iVar4,&local_4c,text_len - iVar4);
    } while (((iVar2 != 0) && (fVar7 < space)) && (fVar8 = fVar7, iVar4 < text_len));
  }
  if (bVar1) {
    *local_48 = local_60;
    *local_40 = fVar6;
    if (local_5c != 0) {
      iVar4 = local_5c;
    }
  }
  else {
    *local_48 = iVar5;
    *local_40 = local_68;
  }
  return iVar4;
}

Assistant:

NK_LIB int
nk_text_clamp(const struct nk_user_font *font, const char *text,
    int text_len, float space, int *glyphs, float *text_width,
    nk_rune *sep_list, int sep_count)
{
    int i = 0;
    int glyph_len = 0;
    float last_width = 0;
    nk_rune unicode = 0;
    float width = 0;
    int len = 0;
    int g = 0;
    float s;

    int sep_len = 0;
    int sep_g = 0;
    float sep_width = 0;
    sep_count = NK_MAX(sep_count,0);

    glyph_len = nk_utf_decode(text, &unicode, text_len);
    while (glyph_len && (width < space) && (len < text_len)) {
        len += glyph_len;
        s = font->width(font->userdata, font->height, text, len);
        for (i = 0; i < sep_count; ++i) {
            if (unicode != sep_list[i]) continue;
            sep_width = last_width = width;
            sep_g = g+1;
            sep_len = len;
            break;
        }
        if (i == sep_count){
            last_width = sep_width = width;
            sep_g = g+1;
        }
        width = s;
        glyph_len = nk_utf_decode(&text[len], &unicode, text_len - len);
        g++;
    }
    if (len >= text_len) {
        *glyphs = g;
        *text_width = last_width;
        return len;
    } else {
        *glyphs = sep_g;
        *text_width = sep_width;
        return (!sep_len) ? len: sep_len;
    }
}